

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

int TIFFReadRGBAStripExt(TIFF *tif,uint32_t row,uint32_t *raster,int stop_on_error)

{
  int iVar1;
  char *pcVar2;
  uint32_t local_4d4;
  uint local_4d0;
  uint32_t rows_to_read;
  uint32_t rowsperstrip;
  int ok;
  TIFFRGBAImage img;
  char emsg [1024];
  int stop_on_error_local;
  uint32_t *raster_local;
  uint32_t row_local;
  TIFF *tif_local;
  
  memset(&img.row_offset,0,0x400);
  iVar1 = TIFFIsTiled(tif);
  if (iVar1 != 0) {
    pcVar2 = TIFFFileName(tif);
    TIFFErrorExtR(tif,pcVar2,"Can\'t use TIFFReadRGBAStrip() with tiled file.");
    return 0;
  }
  TIFFGetFieldDefaulted(tif,0x116,&local_4d0);
  if (row % local_4d0 == 0) {
    iVar1 = TIFFRGBAImageOK(tif,(char *)&img.row_offset);
    if ((iVar1 == 0) ||
       (iVar1 = TIFFRGBAImageBegin((TIFFRGBAImage *)&rowsperstrip,tif,stop_on_error,
                                   (char *)&img.row_offset), iVar1 == 0)) {
      pcVar2 = TIFFFileName(tif);
      TIFFErrorExtR(tif,pcVar2,"%s",&img.row_offset);
      rows_to_read = 0;
    }
    else {
      img.Bitdepth16To8._4_4_ = 0;
      if ((uint)img.alpha < row + local_4d0) {
        local_4d4 = img.alpha - row;
      }
      else {
        local_4d4 = local_4d0;
      }
      img.Bitdepth16To8._0_4_ = row;
      rows_to_read = TIFFRGBAImageGet((TIFFRGBAImage *)&rowsperstrip,raster,img.isContig,local_4d4);
      TIFFRGBAImageEnd((TIFFRGBAImage *)&rowsperstrip);
    }
    return rows_to_read;
  }
  pcVar2 = TIFFFileName(tif);
  TIFFErrorExtR(tif,pcVar2,"Row passed to TIFFReadRGBAStrip() must be first in a strip.");
  return 0;
}

Assistant:

int TIFFReadRGBAStripExt(TIFF *tif, uint32_t row, uint32_t *raster,
                         int stop_on_error)

{
    char emsg[EMSG_BUF_SIZE] = "";
    TIFFRGBAImage img;
    int ok;
    uint32_t rowsperstrip, rows_to_read;

    if (TIFFIsTiled(tif))
    {
        TIFFErrorExtR(tif, TIFFFileName(tif),
                      "Can't use TIFFReadRGBAStrip() with tiled file.");
        return (0);
    }

    TIFFGetFieldDefaulted(tif, TIFFTAG_ROWSPERSTRIP, &rowsperstrip);
    if ((row % rowsperstrip) != 0)
    {
        TIFFErrorExtR(
            tif, TIFFFileName(tif),
            "Row passed to TIFFReadRGBAStrip() must be first in a strip.");
        return (0);
    }

    if (TIFFRGBAImageOK(tif, emsg) &&
        TIFFRGBAImageBegin(&img, tif, stop_on_error, emsg))
    {

        img.row_offset = row;
        img.col_offset = 0;

        if (row + rowsperstrip > img.height)
            rows_to_read = img.height - row;
        else
            rows_to_read = rowsperstrip;

        ok = TIFFRGBAImageGet(&img, raster, img.width, rows_to_read);

        TIFFRGBAImageEnd(&img);
    }
    else
    {
        TIFFErrorExtR(tif, TIFFFileName(tif), "%s", emsg);
        ok = 0;
    }

    return (ok);
}